

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cc
# Opt level: O2

void __thiscall FileWriter::FileWriter(FileWriter *this,string *prefix)

{
  std::__cxx11::string::string((string *)this,(string *)prefix);
  this->force_ = false;
  return;
}

Assistant:

FileWriter::FileWriter(const std::string& prefix) : prefix_(prefix) {
  force_ = false;
}